

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdfrend.c
# Opt level: O3

FT_Error ft_bsdf_render(FT_Renderer_conflict module,FT_GlyphSlot slot,FT_Render_Mode mode,
                       FT_Vector *origin)

{
  FT_Bitmap *pFVar1;
  uint uVar2;
  FT_Memory memory;
  int iVar3;
  FT_Slot_Internal pFVar4;
  FT_Error error;
  SDF_Raster_Params params;
  FT_Error local_cc;
  ulong local_c8;
  FT_Bitmap local_c0;
  FT_Raster_Params local_98;
  undefined4 local_38;
  undefined1 local_34;
  undefined1 local_33;
  
  local_cc = 0;
  FT_Bitmap_Init(&local_c0);
  memory = (module->root).memory;
  if (slot->format == module->glyph_format) {
    if (mode == FT_RENDER_MODE_SDF) {
      if (origin == (FT_Vector *)0x0) {
        if ((slot->internal->flags & 1) == 0) {
          local_cc = 6;
        }
        else {
          pFVar1 = &slot->bitmap;
          if (pFVar1->rows == 0) {
            return 0;
          }
          if ((slot->bitmap).pitch == 0) {
            return 0;
          }
          FT_Bitmap_New(&local_c0);
          uVar2 = *(uint *)&module[1].root.clazz;
          local_c8 = (ulong)uVar2;
          iVar3 = uVar2 * 2;
          local_c0.rows = (slot->bitmap).rows + iVar3;
          local_c0.width = iVar3 + (slot->bitmap).width;
          local_c0.pixel_mode = '\x02';
          local_c0.num_grays = 0xff;
          local_c0.pitch = local_c0.width;
          local_c0.buffer =
               (uchar *)ft_mem_realloc(memory,(long)(int)local_c0.width,0,(ulong)local_c0.rows,
                                       (void *)0x0,&local_cc);
          if (local_cc == 0) {
            local_98.flags = 8;
            local_38 = *(undefined4 *)&module[1].root.clazz;
            local_34 = *(undefined1 *)((long)&module[1].root.clazz + 4);
            local_33 = *(undefined1 *)((long)&module[1].root.clazz + 5);
            local_98.target = &local_c0;
            local_98.source = pFVar1;
            local_cc = (*module->raster_render)(module->raster,&local_98);
            if (local_cc == 0) {
              pFVar4 = slot->internal;
              if ((pFVar4->flags & 1) != 0) {
                ft_mem_free(memory,(slot->bitmap).buffer);
                (slot->bitmap).buffer = (uchar *)0x0;
                pFVar4 = slot->internal;
                pFVar4->flags = pFVar4->flags & 0xfffffffe;
              }
              (slot->bitmap).palette = local_c0.palette;
              (slot->bitmap).buffer = local_c0.buffer;
              (slot->bitmap).num_grays = local_c0.num_grays;
              (slot->bitmap).pixel_mode = local_c0.pixel_mode;
              (slot->bitmap).palette_mode = local_c0.palette_mode;
              *(int *)&(slot->bitmap).field_0x1c = local_c0._28_4_;
              pFVar1->rows = local_c0.rows;
              pFVar1->width = local_c0.width;
              *(ulong *)&(slot->bitmap).pitch = CONCAT44(local_c0._12_4_,local_c0.pitch);
              slot->bitmap_top = slot->bitmap_top + (int)local_c8;
              slot->bitmap_left = slot->bitmap_left - (int)local_c8;
              *(byte *)&pFVar4->flags = (byte)pFVar4->flags | 1;
              return local_cc;
            }
          }
        }
      }
      else {
        local_cc = 7;
      }
    }
    else {
      local_cc = 0x13;
    }
  }
  else {
    local_cc = 0x12;
  }
  if (local_c0.buffer != (uchar *)0x0) {
    ft_mem_free(memory,local_c0.buffer);
  }
  return local_cc;
}

Assistant:

static FT_Error
  ft_bsdf_render( FT_Renderer       module,
                  FT_GlyphSlot      slot,
                  FT_Render_Mode    mode,
                  const FT_Vector*  origin )
  {
    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = NULL;

    FT_Bitmap*   bitmap  = &slot->bitmap;
    FT_Renderer  render  = NULL;
    FT_Bitmap    target;

    FT_Pos  x_pad = 0;
    FT_Pos  y_pad = 0;

    SDF_Raster_Params  params;
    SDF_Renderer       sdf_module = SDF_RENDERER( module );


    /* initialize the bitmap in case any error occurs */
    FT_Bitmap_Init( &target );

    render = &sdf_module->root;
    memory = render->root.memory;

    /* check whether slot format is correct before rendering */
    if ( slot->format != render->glyph_format )
    {
      error = FT_THROW( Invalid_Glyph_Format );
      goto Exit;
    }

    /* check whether render mode is correct */
    if ( mode != FT_RENDER_MODE_SDF )
    {
      error = FT_THROW( Cannot_Render_Glyph );
      goto Exit;
    }

    if ( origin )
    {
      FT_ERROR(( "ft_bsdf_render: can't translate the bitmap\n" ));

      error = FT_THROW( Unimplemented_Feature );
      goto Exit;
    }

    /* Do not generate SDF if the bitmap is not owned by the       */
    /* glyph: it might be that the source buffer is already freed. */
    if ( !( slot->internal->flags & FT_GLYPH_OWN_BITMAP ) )
    {
      FT_ERROR(( "ft_bsdf_render: can't generate SDF from"
                 " unowned source bitmap\n" ));

      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* nothing to render */
    if ( !bitmap->rows || !bitmap->pitch )
      return FT_Err_Ok;

    FT_Bitmap_New( &target );

    /* padding will simply be equal to `spread` */
    x_pad = sdf_module->spread;
    y_pad = sdf_module->spread;

    /* apply padding, which extends to all directions */
    target.rows  = bitmap->rows  + y_pad * 2;
    target.width = bitmap->width + x_pad * 2;

    /* set up the target bitmap */
    target.pixel_mode = FT_PIXEL_MODE_GRAY;
    target.pitch      = (int)( target.width );
    target.num_grays  = 255;

    if ( FT_ALLOC_MULT( target.buffer, target.rows, target.pitch ) )
      goto Exit;

    /* set up parameters */
    params.root.target = &target;
    params.root.source = bitmap;
    params.root.flags  = FT_RASTER_FLAG_SDF;
    params.spread      = sdf_module->spread;
    params.flip_sign   = sdf_module->flip_sign;
    params.flip_y      = sdf_module->flip_y;

    error = render->raster_render( render->raster,
                                   (const FT_Raster_Params*)&params );

  Exit:
    if ( !error )
    {
      /* the glyph is successfully converted to a SDF */
      if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
      {
        FT_FREE( bitmap->buffer );
        slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
      }

      slot->bitmap           = target;
      slot->bitmap_top      += y_pad;
      slot->bitmap_left     -= x_pad;
      slot->internal->flags |= FT_GLYPH_OWN_BITMAP;
    }
    else if ( target.buffer )
      FT_FREE( target.buffer );

    return error;
  }